

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O3

Mat * __thiscall
ncnn::Mat::reshape(Mat *__return_storage_ptr__,Mat *this,int _w,int _h,int _c,Allocator *allocator)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  long lVar4;
  size_t _elemsize;
  int iVar5;
  ulong uVar6;
  Mat local_68;
  
  iVar3 = this->h * this->w * this->c;
  iVar5 = _h * _w;
  if (iVar3 == iVar5 * _c) {
    iVar1 = this->dims;
    lVar4 = (long)iVar5;
    if (iVar1 < 3) {
      _elemsize = this->elemsize;
      if ((long)_h * (long)_w - (_elemsize * lVar4 + 0xf & 0xfffffffffffffff0) / _elemsize != 0) {
        __return_storage_ptr__->dims = 0;
        __return_storage_ptr__->w = 0;
        __return_storage_ptr__->h = 0;
        __return_storage_ptr__->c = 0;
        __return_storage_ptr__->elemsize = 0;
        __return_storage_ptr__->allocator = (Allocator *)0x0;
        __return_storage_ptr__->data = (void *)0x0;
        __return_storage_ptr__->refcount = (int *)0x0;
        __return_storage_ptr__->cstep = 0;
        create(__return_storage_ptr__,_w,_h,_c,_elemsize,allocator);
        if (_c < 1) {
          return __return_storage_ptr__;
        }
        iVar3 = 0;
        uVar6 = 0;
        do {
          memcpy((void *)(__return_storage_ptr__->cstep * uVar6 * __return_storage_ptr__->elemsize +
                         (long)__return_storage_ptr__->data),
                 (void *)(this->elemsize * (long)iVar3 + (long)this->data),this->elemsize * lVar4);
          uVar6 = uVar6 + 1;
          iVar3 = iVar3 + iVar5;
        } while ((uint)_c != uVar6);
        return __return_storage_ptr__;
      }
    }
    else {
      if (this->c != _c) {
        reshape(&local_68,this,iVar3,allocator);
        reshape(__return_storage_ptr__,&local_68,_w,_h,_c,allocator);
        if (local_68.refcount == (int *)0x0) {
          return __return_storage_ptr__;
        }
        LOCK();
        *local_68.refcount = *local_68.refcount + -1;
        UNLOCK();
        if (*local_68.refcount != 0) {
          return __return_storage_ptr__;
        }
        if (local_68.allocator != (Allocator *)0x0) {
          (**(code **)(*(long *)local_68.allocator + 8))();
          return __return_storage_ptr__;
        }
        if (local_68.data == (void *)0x0) {
          return __return_storage_ptr__;
        }
        free(*(void **)((long)local_68.data + -8));
        return __return_storage_ptr__;
      }
      _elemsize = this->elemsize;
    }
    __return_storage_ptr__->data = this->data;
    piVar2 = this->refcount;
    __return_storage_ptr__->refcount = piVar2;
    __return_storage_ptr__->elemsize = _elemsize;
    __return_storage_ptr__->allocator = this->allocator;
    __return_storage_ptr__->dims = iVar1;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
      _elemsize = this->elemsize;
    }
    __return_storage_ptr__->dims = 3;
    __return_storage_ptr__->w = _w;
    __return_storage_ptr__->h = _h;
    __return_storage_ptr__->c = _c;
    __return_storage_ptr__->cstep = (lVar4 * _elemsize + 0xf & 0xfffffffffffffff0) / _elemsize;
  }
  else {
    __return_storage_ptr__->dims = 0;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->h = 0;
    __return_storage_ptr__->c = 0;
    __return_storage_ptr__->elemsize = 0;
    __return_storage_ptr__->allocator = (Allocator *)0x0;
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->refcount = (int *)0x0;
    __return_storage_ptr__->cstep = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

inline Mat Mat::reshape(int _w, int _h, int _c, Allocator* allocator) const
{
    if (w * h * c != _w * _h * _c)
        return Mat();

    if (dims < 3)
    {
        if ((size_t)_w * _h != alignSize(_w * _h * elemsize, 16) / elemsize)
        {
            Mat m;
            m.create(_w, _h, _c, elemsize, allocator);

            // align channel
            for (int i=0; i<_c; i++)
            {
                const void* ptr = (unsigned char*)data + i * _w * _h * elemsize;
                void* mptr = (unsigned char*)m.data + i * m.cstep * m.elemsize;
                memcpy(mptr, ptr, _w * _h * elemsize);
            }

            return m;
        }
    }
    else if (c != _c)
    {
        // flatten and then align
        Mat tmp = reshape(_w * _h * _c, allocator);
        return tmp.reshape(_w, _h, _c, allocator);
    }

    Mat m = *this;

    m.dims = 3;
    m.w = _w;
    m.h = _h;
    m.c = _c;

    m.cstep = alignSize(_w * _h * elemsize, 16) / elemsize;

    return m;
}